

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ObjRemoveFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *pNext;
  int *pPrev;
  int *pNextC;
  int *pPrevC;
  int *pFirst;
  int iFan;
  Gia_Obj_t *pFanout_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (((p->pFanData == (int *)0x0) || (iVar1 = Gia_ObjId(p,pObj), p->nFansAlloc <= iVar1)) ||
     (iVar1 = Gia_ObjId(p,pFanout), p->nFansAlloc <= iVar1)) {
    __assert_fail("p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa6,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_IsComplement(pObj);
  if ((iVar1 != 0) || (iVar1 = Gia_IsComplement(pFanout), iVar1 != 0)) {
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa7,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjId(p,pFanout);
  if (iVar1 < 1) {
    __assert_fail("Gia_ObjId(p, pFanout) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xa8,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjId(p,pFanout);
  iVar2 = Gia_ObjWhatFanin(p,pFanout,pObj);
  iVar1 = Gia_FanoutCreate(iVar1,iVar2);
  piVar3 = Gia_FanoutPrev(p->pFanData,iVar1);
  piVar4 = Gia_FanoutNext(p->pFanData,iVar1);
  piVar5 = Gia_FanoutPrev(p->pFanData,*piVar4);
  piVar6 = Gia_FanoutNext(p->pFanData,*piVar3);
  if (*piVar5 == iVar1) {
    if (*piVar6 != iVar1) {
      __assert_fail("*pNext == iFan",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                    ,0xaf,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    piVar7 = p->pFanData;
    iVar2 = Gia_ObjId(p,pObj);
    piVar7 = Gia_FanoutObj(piVar7,iVar2);
    if (0 < *piVar7) {
      if (*piVar7 == iVar1) {
        if (*piVar4 == iVar1) {
          *piVar7 = 0;
          *piVar5 = 0;
          *piVar6 = 0;
          *piVar3 = 0;
          *piVar4 = 0;
          return;
        }
        *piVar7 = *piVar4;
      }
      *piVar5 = *piVar3;
      *piVar6 = *piVar4;
      *piVar3 = 0;
      *piVar4 = 0;
      return;
    }
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0xb1,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  __assert_fail("*pPrev == iFan",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                ,0xae,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ObjRemoveFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pPrev  = Gia_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Gia_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}